

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

Utils * __thiscall
Utils::getClsidType_abi_cxx11_(Utils *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *vec)

{
  bool bVar1;
  allocator local_65 [13];
  string local_58 [32];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  int local_1c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvStack_18;
  int i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *vec_local;
  
  local_1c = 0;
  pvStack_18 = vec;
  vec_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this;
  while( true ) {
    bVar1 = std::operator!=(&clsid_list[local_1c].clsid,anon_var_dwarf_1cef8);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)this,"Not found",local_65);
      std::allocator<char>::~allocator((allocator<char> *)local_65);
      return this;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_38,vec);
    std::__cxx11::string::string(local_58,(string *)(clsid_list + local_1c));
    bVar1 = compareClsidType(&local_38,(string *)local_58);
    std::__cxx11::string::~string(local_58);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_38);
    if (bVar1) break;
    local_1c = local_1c + 1;
  }
  std::__cxx11::string::string((string *)this,(string *)&clsid_list[local_1c].name);
  return this;
}

Assistant:

std::string Utils::getClsidType(std::vector<unsigned int> vec) {
    for (int i = 0; clsid_list[i].clsid != GUID_Unknown; i++) {
        if (compareClsidType(vec, clsid_list[i].clsid)) {
            return clsid_list[i].name;
        }
    }
    return "Not found";
}